

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O3

void parse_charstrings(T1_Face face,T1_Loader loader)

{
  byte bVar1;
  FT_Memory pFVar2;
  undefined8 *puVar3;
  FT_Byte *pFVar4;
  byte *pbVar5;
  byte *pbVar6;
  ulong __n;
  PS_Table pPVar7;
  PS_Table pPVar8;
  PS_Table pPVar9;
  FT_UInt FVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  FT_Error FVar14;
  FT_Pointer __dest;
  ulong uVar16;
  byte *pbVar17;
  uint uVar18;
  long lVar19;
  FT_Byte notdef_glyph [5];
  FT_Byte *base;
  FT_Error local_80;
  int local_7c;
  int local_78;
  uint local_74;
  PS_Table local_70;
  PS_Table local_68;
  FT_Memory local_60;
  undefined8 local_58;
  undefined8 *local_50;
  PS_Table local_48;
  T1_Face local_40;
  FT_Byte *local_38;
  FT_Long FVar15;
  
  pFVar2 = (loader->parser).root.memory;
  puVar3 = (undefined8 *)face->psaux;
  pFVar4 = (loader->parser).root.cursor;
  pbVar5 = (loader->parser).root.limit;
  FVar15 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
  uVar11 = (uint)FVar15;
  FVar14 = 3;
  if (-1 < (int)uVar11) {
    lVar19 = (long)pbVar5 - (long)pFVar4 >> 3;
    uVar18 = (uint)lVar19;
    if ((long)(ulong)(uVar11 & 0x7fffffff) <= lVar19) {
      uVar18 = uVar11;
    }
    if (uVar18 == 0) {
      return;
    }
    if ((loader->parser).root.error != 0) {
      return;
    }
    local_68 = &loader->glyph_names;
    local_48 = &loader->swap_table;
    local_60 = pFVar2;
    local_50 = puVar3;
    if (loader->num_glyphs == 0) {
      FVar14 = (**(code **)*puVar3)(&loader->charstrings,uVar18 + 6,pFVar2);
      pFVar2 = local_60;
      if (((FVar14 != 0) ||
          (FVar14 = (**(code **)*local_50)(local_68,uVar18 + 6,local_60), FVar14 != 0)) ||
         (FVar14 = (**(code **)*local_50)(local_48,4,pFVar2), FVar14 != 0)) goto LAB_00178dec;
      local_80 = 0;
    }
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
    pbVar17 = (loader->parser).root.cursor;
    if (pbVar17 < pbVar5) {
      local_7c = 0;
      local_74 = 0;
      local_78 = 0;
      local_70 = &loader->charstrings;
      local_40 = face;
      do {
        if (pbVar17 + 3 < pbVar5) {
          bVar1 = pbVar17[3];
          if ((((ulong)bVar1 < 0x3f) && ((0x5000832100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
             || ((bVar1 - 0x5b < 0x23 && ((0x500000005U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) != 0)
                 ))) {
            if (*pbVar17 == 0x65) {
              if ((pbVar17[1] == 0x6e) && (pbVar17[2] == 100)) break;
            }
            else if ((*pbVar17 == 100) &&
                    (((pbVar17[1] == 0x65 && (pbVar17[2] == 0x66)) && (local_7c != 0))))
            goto LAB_00178abf;
          }
        }
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        pbVar6 = (loader->parser).root.cursor;
        if (pbVar5 <= pbVar6) goto LAB_00178c69;
        if ((loader->parser).root.error != 0) {
          return;
        }
        if (*pbVar17 == 0x2f) {
          if (pbVar5 <= pbVar17 + 2) {
LAB_00178cde:
            local_80 = 3;
            FVar14 = local_80;
            goto LAB_00178dec;
          }
          iVar12 = read_binary_data(&loader->parser,&local_58,&local_38,
                                    ((face->root).internal)->incremental_interface !=
                                    (FT_Incremental_InterfaceRec *)0x0);
          iVar13 = local_7c;
          if (iVar12 == 0) {
            return;
          }
          if (loader->num_glyphs == 0) {
            pbVar17 = pbVar17 + 1;
            uVar16 = (long)pbVar6 - (long)pbVar17;
            local_80 = (*(loader->glyph_names).funcs.add)(local_68,local_7c,pbVar17,(int)uVar16 + 1)
            ;
            FVar14 = local_80;
            if (local_80 != 0) goto LAB_00178dec;
            (loader->glyph_names).elements[iVar13][uVar16 & 0xffffffff] = '\0';
            if (*pbVar17 == 0x2e) {
              iVar12 = strcmp(".notdef",(char *)(loader->glyph_names).elements[iVar13]);
              if (iVar12 == 0) {
                local_78 = iVar13;
              }
              local_74 = local_74 & 0xff;
              if (iVar12 == 0) {
                local_74 = 1;
              }
            }
            FVar10 = (FT_UInt)local_58;
            uVar16 = (ulong)(local_40->type1).private_dict.lenIV;
            if (((long)uVar16 < 0) || ((int)(uVar18 + 5) <= iVar13)) {
              local_80 = (*(loader->charstrings).funcs.add)
                                   (local_70,iVar13,local_38,(FT_UInt)local_58);
            }
            else {
              __n = CONCAT44(local_58._4_4_,(FT_UInt)local_58);
              if (__n <= uVar16) goto LAB_00178cde;
              __dest = ft_mem_alloc(local_60,__n,&local_80);
              iVar13 = local_7c;
              FVar14 = local_80;
              if (local_80 != 0) goto LAB_00178dec;
              memcpy(__dest,local_38,__n);
              (*(code *)local_50[4])(__dest,__n,0x10ea);
              iVar12 = (local_40->type1).private_dict.lenIV;
              local_80 = (*(loader->charstrings).funcs.add)
                                   (local_70,iVar13,(void *)((long)__dest + (long)iVar12),
                                    FVar10 - iVar12);
              ft_mem_free(local_60,__dest);
            }
            FVar14 = local_80;
            if (local_80 != 0) goto LAB_00178dec;
            local_7c = local_7c + (uint)(local_80 == 0);
            face = local_40;
          }
        }
        (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
        pbVar17 = (loader->parser).root.cursor;
      } while (pbVar17 < pbVar5);
      FVar14 = 3;
      if (local_7c != 0) {
LAB_00178abf:
        pPVar8 = local_48;
        iVar13 = local_7c;
        loader->num_glyphs = local_7c;
        if ((char)local_74 == '\0') {
          local_58._4_4_ = CONCAT31(local_58._5_3_,0xe);
          local_58._0_4_ = 0xde1f78b;
          FVar14 = (*(loader->swap_table).funcs.add)
                             (local_48,0,*(loader->glyph_names).elements,
                              *(loader->glyph_names).lengths);
          pPVar9 = local_68;
          pPVar7 = local_70;
          if (((FVar14 == 0) &&
              (local_80 = FVar14,
              FVar14 = (*(loader->swap_table).funcs.add)
                                 (pPVar8,1,*(loader->charstrings).elements,
                                  *(loader->charstrings).lengths), FVar14 == 0)) &&
             ((local_80 = FVar14, FVar14 = (*(loader->glyph_names).funcs.add)(pPVar9,0,".notdef",8),
              FVar14 == 0 &&
              (((local_80 = FVar14,
                FVar14 = (*(loader->charstrings).funcs.add)(pPVar7,0,&local_58,5), FVar14 == 0 &&
                (local_80 = FVar14,
                FVar14 = (*(loader->glyph_names).funcs.add)
                                   (pPVar9,iVar13,*(loader->swap_table).elements,
                                    *(loader->swap_table).lengths), FVar14 == 0)) &&
               (local_80 = FVar14,
               FVar14 = (*(loader->charstrings).funcs.add)
                                  (local_70,iVar13,(loader->swap_table).elements[1],
                                   (loader->swap_table).lengths[1]), FVar14 == 0)))))) {
            loader->num_glyphs = loader->num_glyphs + 1;
            return;
          }
        }
        else {
          pFVar4 = *(loader->glyph_names).elements;
          iVar13 = strcmp(".notdef",(char *)pFVar4);
          pPVar7 = local_48;
          pPVar8 = local_68;
          if (iVar13 == 0) {
            return;
          }
          FVar14 = (*(loader->swap_table).funcs.add)
                             (local_48,0,pFVar4,*(loader->glyph_names).lengths);
          if ((FVar14 == 0) &&
             (local_80 = FVar14,
             FVar14 = (*(loader->swap_table).funcs.add)
                                (pPVar7,1,*(loader->charstrings).elements,
                                 *(loader->charstrings).lengths), FVar14 == 0)) {
            lVar19 = (long)local_78;
            local_80 = FVar14;
            FVar14 = (*(loader->swap_table).funcs.add)
                               (pPVar7,2,(loader->glyph_names).elements[lVar19],
                                (loader->glyph_names).lengths[lVar19]);
            if ((((FVar14 == 0) &&
                 ((local_80 = FVar14,
                  FVar14 = (*(loader->swap_table).funcs.add)
                                     (pPVar7,3,(loader->charstrings).elements[lVar19],
                                      (loader->charstrings).lengths[lVar19]), FVar14 == 0 &&
                  (local_80 = FVar14,
                  FVar14 = (*(loader->glyph_names).funcs.add)
                                     (pPVar8,local_78,*(loader->swap_table).elements,
                                      *(loader->swap_table).lengths), FVar14 == 0)))) &&
                (local_80 = FVar14,
                FVar14 = (*(loader->charstrings).funcs.add)
                                   (local_70,local_78,(loader->swap_table).elements[1],
                                    (loader->swap_table).lengths[1]), FVar14 == 0)) &&
               ((local_80 = FVar14,
                FVar14 = (*(loader->glyph_names).funcs.add)
                                   (local_68,0,(loader->swap_table).elements[2],
                                    (loader->swap_table).lengths[2]), FVar14 == 0 &&
                (local_80 = FVar14,
                FVar14 = (*(loader->charstrings).funcs.add)
                                   (local_70,0,(loader->swap_table).elements[3],
                                    (loader->swap_table).lengths[3]), FVar14 == 0)))) {
              return;
            }
          }
        }
      }
    }
    else {
LAB_00178c69:
      FVar14 = 3;
    }
  }
LAB_00178dec:
  (loader->parser).root.error = FVar14;
  return;
}

Assistant:

static void
  parse_charstrings( T1_Face    face,
                     T1_Loader  loader )
  {
    T1_Parser      parser       = &loader->parser;
    PS_Table       code_table   = &loader->charstrings;
    PS_Table       name_table   = &loader->glyph_names;
    PS_Table       swap_table   = &loader->swap_table;
    FT_Memory      memory       = parser->root.memory;
    FT_Error       error;

    PSAux_Service  psaux        = (PSAux_Service)face->psaux;

    FT_Byte*       cur          = parser->root.cursor;
    FT_Byte*       limit        = parser->root.limit;
    FT_Int         n, num_glyphs;
    FT_Int         notdef_index = 0;
    FT_Byte        notdef_found = 0;


    num_glyphs = (FT_Int)T1_ToInt( parser );
    if ( num_glyphs < 0 )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    /* we certainly need more than 8 bytes per glyph */
    if ( num_glyphs > ( limit - cur ) >> 3 )
    {
      FT_TRACE0(( "parse_charstrings: adjusting number of glyphs"
                  " (from %d to %d)\n",
                  num_glyphs, ( limit - cur ) >> 3 ));
      num_glyphs = ( limit - cur ) >> 3;
    }

    /* some fonts like Optima-Oblique not only define the /CharStrings */
    /* array but access it also                                        */
    if ( num_glyphs == 0 || parser->root.error )
      return;

    /* initialize tables, leaving space for addition of .notdef, */
    /* if necessary, and a few other glyphs to handle buggy      */
    /* fonts which have more glyphs than specified.              */

    /* for some non-standard fonts like `Optima' which provides  */
    /* different outlines depending on the resolution it is      */
    /* possible to get here twice                                */
    if ( !loader->num_glyphs )
    {
      error = psaux->ps_table_funcs->init(
                code_table, num_glyphs + 1 + TABLE_EXTEND, memory );
      if ( error )
        goto Fail;

      error = psaux->ps_table_funcs->init(
                name_table, num_glyphs + 1 + TABLE_EXTEND, memory );
      if ( error )
        goto Fail;

      /* Initialize table for swapping index notdef_index and */
      /* index 0 names and codes (if necessary).              */

      error = psaux->ps_table_funcs->init( swap_table, 4, memory );
      if ( error )
        goto Fail;
    }

    n = 0;

    for (;;)
    {
      FT_ULong  size;
      FT_Byte*  base;


      /* the format is simple:        */
      /*   `/glyphname' + binary data */

      T1_Skip_Spaces( parser );

      cur = parser->root.cursor;
      if ( cur >= limit )
        break;

      /* we stop when we find a `def' or `end' keyword */
      if ( cur + 3 < limit && IS_PS_DELIM( cur[3] ) )
      {
        if ( cur[0] == 'd' &&
             cur[1] == 'e' &&
             cur[2] == 'f' )
        {
          /* There are fonts which have this: */
          /*                                  */
          /*   /CharStrings 118 dict def      */
          /*   Private begin                  */
          /*   CharStrings begin              */
          /*   ...                            */
          /*                                  */
          /* To catch this we ignore `def' if */
          /* no charstring has actually been  */
          /* seen.                            */
          if ( n )
            break;
        }

        if ( cur[0] == 'e' &&
             cur[1] == 'n' &&
             cur[2] == 'd' )
          break;
      }

      T1_Skip_PS_Token( parser );
      if ( parser->root.cursor >= limit )
      {
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }
      if ( parser->root.error )
        return;

      if ( *cur == '/' )
      {
        FT_UInt  len;


        if ( cur + 2 >= limit )
        {
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        cur++;                              /* skip `/' */
        len = (FT_UInt)( parser->root.cursor - cur );

        if ( !read_binary_data( parser, &size, &base, IS_INCREMENTAL ) )
          return;

        /* for some non-standard fonts like `Optima' which provides */
        /* different outlines depending on the resolution it is     */
        /* possible to get here twice                               */
        if ( loader->num_glyphs )
          continue;

        error = T1_Add_Table( name_table, n, cur, len + 1 );
        if ( error )
          goto Fail;

        /* add a trailing zero to the name table */
        name_table->elements[n][len] = '\0';

        /* record index of /.notdef */
        if ( *cur == '.'                                              &&
             ft_strcmp( ".notdef",
                        (const char*)(name_table->elements[n]) ) == 0 )
        {
          notdef_index = n;
          notdef_found = 1;
        }

        if ( face->type1.private_dict.lenIV >= 0 &&
             n < num_glyphs + TABLE_EXTEND       )
        {
          FT_Byte*  temp = NULL;


          if ( size <= (FT_ULong)face->type1.private_dict.lenIV )
          {
            error = FT_THROW( Invalid_File_Format );
            goto Fail;
          }

          /* t1_decrypt() shouldn't write to base -- make temporary copy */
          if ( FT_ALLOC( temp, size ) )
            goto Fail;
          FT_MEM_COPY( temp, base, size );
          psaux->t1_decrypt( temp, size, 4330 );
          size -= (FT_ULong)face->type1.private_dict.lenIV;
          error = T1_Add_Table( code_table, n,
                                temp + face->type1.private_dict.lenIV, size );
          FT_FREE( temp );
        }
        else
          error = T1_Add_Table( code_table, n, base, size );
        if ( error )
          goto Fail;

        n++;
      }
    }

    if ( !n )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    loader->num_glyphs = n;

    /* if /.notdef is found but does not occupy index 0, do our magic. */
    if ( notdef_found                                                 &&
         ft_strcmp( ".notdef", (const char*)name_table->elements[0] ) )
    {
      /* Swap glyph in index 0 with /.notdef glyph.  First, add index 0  */
      /* name and code entries to swap_table.  Then place notdef_index   */
      /* name and code entries into swap_table.  Then swap name and code */
      /* entries at indices notdef_index and 0 using values stored in    */
      /* swap_table.                                                     */

      /* Index 0 name */
      error = T1_Add_Table( swap_table, 0,
                            name_table->elements[0],
                            name_table->lengths [0] );
      if ( error )
        goto Fail;

      /* Index 0 code */
      error = T1_Add_Table( swap_table, 1,
                            code_table->elements[0],
                            code_table->lengths [0] );
      if ( error )
        goto Fail;

      /* Index notdef_index name */
      error = T1_Add_Table( swap_table, 2,
                            name_table->elements[notdef_index],
                            name_table->lengths [notdef_index] );
      if ( error )
        goto Fail;

      /* Index notdef_index code */
      error = T1_Add_Table( swap_table, 3,
                            code_table->elements[notdef_index],
                            code_table->lengths [notdef_index] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, notdef_index,
                            swap_table->elements[0],
                            swap_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, notdef_index,
                            swap_table->elements[1],
                            swap_table->lengths [1] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, 0,
                            swap_table->elements[2],
                            swap_table->lengths [2] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, 0,
                            swap_table->elements[3],
                            swap_table->lengths [3] );
      if ( error )
        goto Fail;

    }
    else if ( !notdef_found )
    {
      /* notdef_index is already 0, or /.notdef is undefined in   */
      /* charstrings dictionary.  Worry about /.notdef undefined. */
      /* We take index 0 and add it to the end of the table(s)    */
      /* and add our own /.notdef glyph to index 0.               */

      /* 0 333 hsbw endchar */
      FT_Byte  notdef_glyph[] = { 0x8B, 0xF7, 0xE1, 0x0D, 0x0E };
      char*    notdef_name    = (char *)".notdef";


      error = T1_Add_Table( swap_table, 0,
                            name_table->elements[0],
                            name_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( swap_table, 1,
                            code_table->elements[0],
                            code_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, 0, notdef_name, 8 );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, 0, notdef_glyph, 5 );

      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, n,
                            swap_table->elements[0],
                            swap_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, n,
                            swap_table->elements[1],
                            swap_table->lengths [1] );
      if ( error )
        goto Fail;

      /* we added a glyph. */
      loader->num_glyphs += 1;
    }

    return;

  Fail:
    parser->root.error = error;
  }